

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeFunction<false,true,false,false>
               (DynamicObject *instance,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *instance_00;
  DeferredTypeHandlerBase *this;
  bool bVar1;
  int iVar2;
  Type *this_00;
  DynamicTypeHandler **ppDVar3;
  FunctionProxy *this_01;
  JavascriptString *local_58;
  JavascriptString *functionName;
  ParseableFunctionInfo *funcInfo;
  ScriptFunction *pSStack_40;
  bool useAnonymous;
  ScriptFunction *scriptFunction;
  JavascriptLibrary *javascriptLibrary;
  JavascriptFunction *function;
  DeferredTypeHandlerBase *pDStack_20;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *instance_local;
  
  function._4_4_ = mode;
  pDStack_20 = typeHandler;
  typeHandler_local = (DeferredTypeHandlerBase *)instance;
  javascriptLibrary = (JavascriptLibrary *)VarTo<Js::JavascriptFunction,Js::DynamicObject>(instance)
  ;
  this_00 = RecyclableObject::GetType((RecyclableObject *)javascriptLibrary);
  scriptFunction = (ScriptFunction *)Js::Type::GetLibrary(this_00);
  pSStack_40 = (ScriptFunction *)0x0;
  funcInfo._7_1_ = 0;
  bVar1 = VarIs<Js::ScriptFunction,Js::JavascriptFunction>((JavascriptFunction *)javascriptLibrary);
  if (bVar1) {
    pSStack_40 = VarTo<Js::ScriptFunction,Js::JavascriptFunction>
                           ((JavascriptFunction *)javascriptLibrary);
    iVar2 = (*(pSStack_40->super_ScriptFunctionBase).super_JavascriptFunction.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x77])();
    funcInfo._7_1_ = (byte)iVar2 & 1;
  }
  this = pDStack_20;
  instance_00 = javascriptLibrary;
  if ((funcInfo._7_1_ & 1) == 0) {
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicTypeHandler__
                        ((WriteBarrierPtr *)
                         &scriptFunction[0x2f].super_ScriptFunctionBase.super_JavascriptFunction.
                          super_DynamicObject.field_1.objectArray);
    DeferredTypeHandlerBase::ConvertFunction(this,(JavascriptFunction *)instance_00,*ppDVar3);
  }
  else {
    ppDVar3 = Memory::WriteBarrierPtr::operator_cast_to_DynamicTypeHandler__
                        ((WriteBarrierPtr *)
                         &scriptFunction[0x2f].super_ScriptFunctionBase.super_JavascriptFunction.
                          super_DynamicObject.super_RecyclableObject.type);
    DeferredTypeHandlerBase::ConvertFunction(this,(JavascriptFunction *)instance_00,*ppDVar3);
  }
  if (pSStack_40 != (ScriptFunction *)0x0) {
    this_01 = ScriptFunction::GetFunctionProxy(pSStack_40);
    functionName = (JavascriptString *)FunctionProxy::EnsureDeserialized(this_01);
    if ((funcInfo._7_1_ & 1) != 0) {
      return true;
    }
    bVar1 = ParseableFunctionInfo::GetIsStaticNameFunction((ParseableFunctionInfo *)functionName);
    if (bVar1) {
      return true;
    }
  }
  local_58 = (JavascriptString *)0x0;
  bVar1 = JavascriptFunction::GetFunctionName((JavascriptFunction *)javascriptLibrary,&local_58);
  if (bVar1) {
    (*(javascriptLibrary->super_JavascriptLibraryBase).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (javascriptLibrary,0x106,local_58,2,0,0,0xf);
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeFunction(DynamicObject *instance, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        JavascriptFunction * function = VarTo<JavascriptFunction>(instance);
        JavascriptLibrary* javascriptLibrary = function->GetType()->GetLibrary();
        ScriptFunction *scriptFunction = nullptr;
        bool useAnonymous = false;
        if (VarIs<ScriptFunction>(function))
        {
            scriptFunction = Js::VarTo<Js::ScriptFunction>(function);
            useAnonymous = scriptFunction->IsAnonymousFunction();
        }

        if (!addPrototype)
        {
            if (!useAnonymous && addName)
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionTypeHandlerWithLength : javascriptLibrary->functionTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionTypeHandler);
            }
        }
        else
        {
            if (useAnonymous)
            {
                typeHandler->ConvertFunction(function, javascriptLibrary->anonymousFunctionWithPrototypeTypeHandler);
            }
            else
            {
                typeHandler->ConvertFunction(function, useLengthType ? javascriptLibrary->functionWithPrototypeAndLengthTypeHandler : javascriptLibrary->functionWithPrototypeTypeHandler);
            }
            DynamicObject *protoObject = javascriptLibrary->CreateConstructorPrototypeObject(function);
            if (scriptFunction && scriptFunction->GetFunctionInfo()->IsClassConstructor())
            {
                function->SetPropertyWithAttributes(PropertyIds::prototype, protoObject, PropertyNone, nullptr);
            }
            else
            {
                function->SetProperty(PropertyIds::prototype, protoObject, PropertyOperation_None, nullptr);
            }
        }

        if (scriptFunction)
        {
            ParseableFunctionInfo * funcInfo = scriptFunction->GetFunctionProxy()->EnsureDeserialized();

            CompileAssert(!addLength || useLengthType);
            if (addLength)
            {
                function->SetPropertyWithAttributes(PropertyIds::length, TaggedInt::ToVarUnchecked(funcInfo->GetReportedInParamsCount() - 1), PropertyConfigurable, nullptr, PropertyOperation_None, SideEffects_None);
            }

            if (useAnonymous || funcInfo->GetIsStaticNameFunction())
            {
                return true;
            }
        }

        if (addName)
        {
            JavascriptString * functionName = nullptr;
            if (((Js::JavascriptFunction*)function)->GetFunctionName(&functionName))
            {
                function->SetPropertyWithAttributes(PropertyIds::name, functionName, PropertyConfigurable, nullptr);
            }
        }

        return true;
    }